

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O3

void __thiscall
rw::ps2::MatPipeline::instance(MatPipeline *this,Geometry *g,InstanceData *inst,Mesh *m)

{
  uint uVar1;
  long lVar2;
  PipeAttribute *pPVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint8 *puVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint32 uVar12;
  uint uVar13;
  uint32 uVar14;
  uint uVar15;
  uint32 *p;
  uint i;
  InstMeshInfo im;
  uint8 *datap [10];
  uint32 local_104;
  InstMeshInfo local_d8;
  uint8 *local_88 [11];
  
  getInstMeshInfo(&local_d8,this,g,m);
  uVar14 = (local_d8.size2 + local_d8.size) * 0x10 + 0x7f;
  inst->dataSize = uVar14;
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2.cpp line: 644"
  ;
  puVar7 = (uint8 *)(*DAT_00149de8)(uVar14,0x3000f);
  inst->dataRaw = puVar7;
  p = (uint32 *)((ulong)(puVar7 + 0x7f) & 0xffffffffffffff80);
  inst->data = (uint8 *)p;
  lVar8 = 0;
  do {
    lVar2 = *(long *)((long)this->attribs + lVar8 * 2);
    if ((lVar2 != 0) && ((*(byte *)(lVar2 + 8) & 6) != 0)) {
      *(ulong *)((long)local_88 + lVar8 * 2) =
           (ulong)(uint)(*(int *)((long)local_d8.attribPos + lVar8) << 4) + (long)p;
    }
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x28);
  uVar9 = 0x6000000;
  if (0x34fff < version) {
    uVar9 = 0x11000000;
  }
  if (local_d8.numBrokenAttribs == 0) {
    *p = local_d8.size - 1 | 0x60000000;
    p[1] = 0;
    p[2] = 0x11000000;
    p[3] = uVar9;
    p = p + 4;
  }
  if (local_d8.numBatches != 0) {
    uVar15 = 0;
    local_104 = 0;
    do {
      uVar11 = local_d8.lastBatchSize;
      uVar14 = local_d8.batchSize;
      uVar10 = local_d8.numBatches - 1;
      uVar1 = local_d8.attribPos[(ulong)(uVar10 <= uVar15) - 8];
      lVar8 = 0;
      do {
        pPVar3 = this->attribs[lVar8];
        if ((pPVar3 != (PipeAttribute *)0x0) && (uVar5 = pPVar3->attrib, (uVar5 & 6) != 0)) {
          uVar13 = ((uVar5 >> 0x1a & 3) + 1) *
                   *(int *)(attribSize(unsigned_int)::size + (uVar5 >> 0x16 & 0xc)) >> 3;
          uVar5 = uVar13 * uVar1 + 0xf;
          *p = uVar5 >> 4 | 0x30000000;
          p[1] = local_d8.attribPos[lVar8];
          p[2] = this->inputStride | 0x1000100;
          uVar4 = ((ulong)uVar5 & 0xfffffffffffffff0) / (ulong)uVar13;
          iVar6 = (int)uVar4;
          uVar5 = (uint)lVar8 | pPVar3->attrib & 0xff004000 | iVar6 << 0x10 | 0x8000;
          p[3] = uVar5;
          if (this->vifOffset < this->inputStride * iVar6) {
            fprintf(_stderr,"WARNING: PS2 instance data over vifOffset %08X, %X-> %X %X\n",
                    (ulong)uVar5,uVar4);
          }
          p[4] = 0x10000000;
          p[5] = 0;
          p[6] = 0;
          p[7] = 0;
          p = p + 8;
          uVar12 = local_d8.batchVertCount - 2;
          if (g->meshHeader->flags != 1) {
            uVar12 = local_d8.batchVertCount;
          }
          local_d8.attribPos[lVar8] = local_d8.attribPos[lVar8] + (uVar12 * uVar13 + 0xf >> 4);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 10);
      if (local_d8.numBrokenAttribs != 0) {
        if (uVar15 < uVar10) {
          uVar11 = uVar14;
        }
        uVar10 = 0x60000000;
        if (uVar15 < local_d8.numBatches - 1) {
          uVar10 = 0x10000000;
        }
        *p = uVar10 | uVar11;
        p[1] = 0;
        p[2] = 0;
        p[3] = 0;
        p = p + 4;
      }
      lVar8 = 0;
      do {
        pPVar3 = this->attribs[lVar8];
        if ((pPVar3 != (PipeAttribute *)0x0) && ((pPVar3->attrib & 6) == 0)) {
          uVar11 = 0;
          if (version < 0x35000) {
            uVar11 = markcnt | 0x7000000;
            markcnt = markcnt + 1;
          }
          *p = uVar11;
          p[1] = 0x5000000;
          p[2] = this->inputStride | 0x1000100;
          p[3] = uVar1 << 0x10 | (uint)lVar8 | pPVar3->attrib & 0xff004000 | 0x8000;
          p = p + 4;
          if (pPVar3 == (PipeAttribute *)attribXYZ) {
            p = instanceXYZ(p,g,m,local_104,uVar1);
          }
          else if (pPVar3 == (PipeAttribute *)attribXYZW) {
            p = instanceXYZW(p,g,m,local_104,uVar1);
          }
          else if (pPVar3 == (PipeAttribute *)attribUV) {
            p = instanceUV(p,g,m,local_104,uVar1);
          }
          else if (pPVar3 == (PipeAttribute *)attribUV2) {
            p = instanceUV2(p,g,m,local_104,uVar1);
          }
          else if (pPVar3 == (PipeAttribute *)attribRGBA) {
            p = instanceRGBA(p,g,m,local_104,uVar1);
          }
          else if (pPVar3 == (PipeAttribute *)attribNormal) {
            p = instanceNormal(p,g,m,local_104,uVar1);
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 10);
      uVar14 = local_d8.batchVertCount - 2;
      if (g->meshHeader->flags != 1) {
        uVar14 = local_d8.batchVertCount;
      }
      local_104 = local_104 + uVar14;
      *p = uVar1 | 0x4000000;
      p[1] = (uint)(uVar15 != 0) << 0x19 | 0x15000000;
      uVar11 = 0x11000000;
      uVar1 = uVar9;
      if (uVar15 < local_d8.numBatches - 1) {
        uVar11 = 0;
        uVar1 = 0;
      }
      p[2] = uVar11;
      p[3] = uVar1;
      p = p + 4;
      uVar15 = uVar15 + 1;
    } while (uVar15 < local_d8.numBatches);
  }
  if (this->instanceCB != (_func_void_MatPipeline_ptr_Geometry_ptr_Mesh_ptr_uint8_ptr_ptr *)0x0) {
    (*this->instanceCB)(this,g,m,local_88);
  }
  return;
}

Assistant:

void
MatPipeline::instance(Geometry *g, InstanceData *inst, Mesh *m)
{
	PipeAttribute *a;
	InstMeshInfo im = getInstMeshInfo(this, g, m);

	inst->dataSize = (im.size+im.size2)<<4;
	// TODO: do this properly, just a test right now
	inst->dataSize += 0x7F;
	inst->dataRaw = rwNewT(uint8, inst->dataSize, MEMDUR_EVENT | ID_GEOMETRY);
	inst->data = ALIGNPTR(inst->dataRaw, 0x80);

	/* make array of addresses of broken out sections */
	uint8 *datap[nelem(this->attribs)];
	uint8 **dp = datap;
	for(uint i = 0; i < nelem(this->attribs); i++)
		if((a = this->attribs[i]) && a->attrib & AT_RW)
			dp[i] = inst->data + im.attribPos[i]*0x10;

	// TODO: not sure if this is correct
	uint32 msk_flush = rw::version >= 0x35000 ? VIF_FLUSH : VIF_MSKPATH3;

	uint32 idx = 0;
	uint32 *p = (uint32*)inst->data;
	if(im.numBrokenAttribs == 0){
		*p++ = DMAret | im.size-1;
		*p++ = 0;
		*p++ = VIF_FLUSH;
		*p++ = msk_flush;
	}
	for(uint32 j = 0; j < im.numBatches; j++){
		uint32 nverts, bsize;
		if(j < im.numBatches-1){
			bsize = im.batchSize;
			nverts = im.batchVertCount;
		}else{
			bsize = im.lastBatchSize;
			nverts = im.lastBatchVertCount;
		}
		for(uint i = 0; i < nelem(this->attribs); i++)
			if((a = this->attribs[i]) && a->attrib & AT_RW){
				uint32 atsz = attribSize(a->attrib);
				*p++ = DMAref | QWC(nverts*atsz);
				*p++ = im.attribPos[i];
				*p++ = VIF_STCYCL1 | this->inputStride;
				// Round up nverts so UNPACK will fit exactly into the DMA packet
				//  (can't pad with zeroes in broken out sections).
				int num = (QWC(nverts*atsz)<<4)/atsz;
				*p++ = (a->attrib&0xFF004000)
					| 0x8000 | num << 16 | i; // UNPACK
				// This probably shouldn't happen.
				if(num*this->inputStride > this->vifOffset)
					fprintf(stderr, "WARNING: PS2 instance data over vifOffset %08X, %X-> %X %X\n",
						p[-1], num,
						num*this->inputStride, this->vifOffset);

				*p++ = DMAcnt;
				*p++ = 0x0;
				*p++ = VIF_NOP;
				*p++ = VIF_NOP;

				im.attribPos[i] += g->meshHeader->flags == 1 ?
					QWC((im.batchVertCount-2)*atsz) :
					QWC(im.batchVertCount*atsz);
			}
		if(im.numBrokenAttribs){
			*p++ = (j < im.numBatches-1 ? DMAcnt : DMAret) | bsize;
			*p++ = 0x0;
			*p++ = VIF_NOP;
			*p++ = VIF_NOP;
		}

		for(uint i = 0; i < nelem(this->attribs); i++)
			if((a = this->attribs[i]) && (a->attrib & AT_RW) == 0){
				if(rw::version >= 0x35000)
					*p++ = VIF_NOP;
				else
					*p++ = VIF_MARK | markcnt++;
				*p++ = VIF_STMOD;
				*p++ = VIF_STCYCL1 | this->inputStride;
				*p++ = (a->attrib&0xFF004000)
					| 0x8000 | nverts << 16 | i; // UNPACK

				if(a == &attribXYZ)
					p = instanceXYZ(p, g, m, idx, nverts);
				else if(a == &attribXYZW)
					p = instanceXYZW(p, g, m, idx, nverts);
				else if(a == &attribUV)
					p = instanceUV(p, g, m, idx, nverts);
				else if(a == &attribUV2)
					p = instanceUV2(p, g, m, idx, nverts);
				else if(a == &attribRGBA)
					p = instanceRGBA(p, g, m, idx, nverts);
				else if(a == &attribNormal)
					p = instanceNormal(p, g, m, idx, nverts);
			}
		idx += g->meshHeader->flags == 1
			? im.batchVertCount-2 : im.batchVertCount;

		*p++ = VIF_ITOP | nverts;
		*p++ = j == 0 ? VIF_MSCALF : VIF_MSCNT;
		if(j < im.numBatches-1){
			*p++ = VIF_NOP;
			*p++ = VIF_NOP;
		}else{
			*p++ = VIF_FLUSH;
			*p++ = msk_flush;
		}
	}

	if(this->instanceCB)
		this->instanceCB(this, g, m, datap);
#ifdef RW_PS2
	if(im.numBrokenAttribs)
		fixDmaOffsets(inst);
#endif
}